

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address)

{
  _Bool isBigEndian;
  int feature;
  DecodeStatus DVar1;
  cs_struct *handle;
  cs_detail *pcVar2;
  MCRegisterInfo *in_stack_00000008;
  uint32_t Insn;
  uint32_t local_3c;
  uint16_t *local_38;
  
  if (code_len < 4) {
    return false;
  }
  feature = *(int *)(ud + 4);
  isBigEndian = *(_Bool *)(ud + 0x28);
  pcVar2 = instr->flat_insn->detail;
  local_38 = size;
  if (pcVar2 == (cs_detail *)0x0) {
    pcVar2 = (cs_detail *)0x0;
  }
  else {
    memset(pcVar2,0,0x5f8);
    pcVar2 = instr->flat_insn->detail;
  }
  readInstruction32(code,&local_3c,isBigEndian,false);
  if (pcVar2 != (cs_detail *)0x0) {
    memset(pcVar2,0,0x5f8);
  }
  DVar1 = decodeInstruction(DecoderTableMips6432,instr,local_3c,address,in_stack_00000008,feature);
  if ((DVar1 == MCDisassembler_Fail) &&
     (DVar1 = decodeInstruction(DecoderTableMips32,instr,local_3c,address,in_stack_00000008,feature)
     , DVar1 == MCDisassembler_Fail)) {
    return false;
  }
  *local_38 = 4;
  return DVar1 == MCDisassembler_Success;
}

Assistant:

static DecodeStatus Mips64Disassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;
	DecodeStatus Result;

	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian, false);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips6432, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	// If we fail to decode in Mips64 decoder space we can try in Mips32
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}